

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<int,short>
               (void *ptr,size_t n_els,FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  int iVar1;
  size_type sVar2;
  char *__ptr;
  vector<char,_std::allocator<char>_> *ptr_00;
  vector<char,_std::allocator<char>_> *in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  byte in_R8B;
  size_t n_read;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  
  if (in_RSI != (vector<char,_std::allocator<char>_> *)0x0) {
    iVar1 = feof(*(FILE **)&(in_RDX->super__Vector_base<char,_std::allocator<char>_>)._M_impl);
    if (iVar1 != 0) {
      throw_feoferr();
    }
    sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RCX);
    if (sVar2 < (ulong)((long)in_RSI << 1)) {
      std::vector<char,_std::allocator<char>_>::resize(in_RSI,(size_type)in_RDX);
    }
    __ptr = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0x66254b);
    ptr_00 = (vector<char,_std::allocator<char>_> *)
             fread(__ptr,2,(size_t)in_RSI,
                   *(FILE **)&(in_RDX->super__Vector_base<char,_std::allocator<char>_>)._M_impl);
    uVar3 = true;
    if (ptr_00 == in_RSI) {
      iVar1 = ferror(*(FILE **)&(in_RDX->super__Vector_base<char,_std::allocator<char>_>)._M_impl);
      uVar3 = iVar1 != 0;
    }
    if ((bool)uVar3 != false) {
      throw_ferror((FILE *)0x6625aa);
    }
    if ((in_R8B & 1) != 0) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x6625bb);
      swap_endianness<short>((short *)ptr_00,CONCAT17(uVar3,in_stack_ffffffffffffffc8));
    }
    convert_dtype<int,short>(in_RSI,in_RDX,(size_t)in_RCX);
  }
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, FILE *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(feof(in))) throw_feoferr();
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    size_t n_read = fread(buffer.data(), sizeof(saved_type), n_els, in);
    if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}